

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::PatchPutValueWithThisPtrCantChangeType<Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               Var thisInstance,PropertyOperationFlags flags)

{
  bool bVar1;
  DynamicObject *pDVar2;
  Type *pTVar3;
  undefined1 local_49;
  undefined8 local_48;
  Type *oldType;
  Var newValue_local;
  PropertyId propertyId_local;
  Var instance_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  bVar1 = VarIs<Js::DynamicObject>(instance);
  if (bVar1) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject>(instance);
    local_48 = RecyclableObject::GetType(&pDVar2->super_RecyclableObject);
  }
  else {
    local_48 = (Type *)0x0;
  }
  PatchPutValueWithThisPtr<true,Js::InlineCache>
            (functionBody,inlineCache,inlineCacheIndex,instance,propertyId,newValue,thisInstance,
             flags);
  local_49 = false;
  if (local_48 != (Type *)0x0) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject>(instance);
    pTVar3 = RecyclableObject::GetType(&pDVar2->super_RecyclableObject);
    local_49 = local_48 != pTVar3;
  }
  return local_49;
}

Assistant:

inline bool JavascriptOperators::PatchPutValueWithThisPtrCantChangeType(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, Var thisInstance, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutValueWithThisPtrCantChangeType);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchPutValueWithThisPtrCantChangeType, Op_PatchPutValueWithThisPtr);

        Type * oldType = VarIs<DynamicObject>(instance) ? UnsafeVarTo<DynamicObject>(instance)->GetType() : nullptr;
        PatchPutValueWithThisPtr<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, instance, propertyId, newValue, thisInstance, flags);
        return (oldType != nullptr && oldType != UnsafeVarTo<DynamicObject>(instance)->GetType());

        JIT_HELPER_END(Op_PatchPutValueWithThisPtrCantChangeType);
    }